

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeGeneric.cpp
# Opt level: O1

void __thiscall
chrono::ChConstraintThreeGeneric::MultiplyTandAdd
          (ChConstraintThreeGeneric *this,ChVectorDynamic<double> *result,double l)

{
  ChVariables *pCVar1;
  ulong uVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Index size;
  ulong uVar7;
  double *pdVar8;
  Index index;
  Index index_1;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined8 in_XMM0_Qb;
  
  pCVar1 = (this->super_ChConstraintThree).variables_a;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if ((long)uVar2 < 0) goto LAB_007f5a5b;
    uVar7 = (ulong)pCVar1->offset;
    if (((long)(uVar2 | uVar7) < 0) ||
       ((long)((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows - uVar2) < (long)uVar7)) goto LAB_007f5a7d;
    pdVar8 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + uVar7;
    uVar7 = uVar2;
    if ((((ulong)pdVar8 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7), (long)uVar2 <= (long)uVar7)
       ) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    uVar10 = uVar2 - uVar7;
    uVar9 = uVar10 + 7;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if (0 < (long)uVar7) {
      uVar11 = 0;
      do {
        pdVar8[uVar11] = l * pdVar3[uVar11] + pdVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    uVar9 = (uVar9 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar10) {
      auVar4._8_8_ = in_XMM0_Qb;
      auVar4._0_8_ = l;
      auVar12 = vbroadcastsd_avx512f(auVar4);
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar13 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])(pdVar8 + uVar7));
        *(undefined1 (*) [64])(pdVar8 + uVar7) = auVar13;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar2) {
      do {
        pdVar8[uVar9] = l * pdVar3[uVar9] + pdVar8[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_b;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if ((long)uVar2 < 0) goto LAB_007f5a5b;
    uVar7 = (ulong)pCVar1->offset;
    if (((long)(uVar2 | uVar7) < 0) ||
       ((long)((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows - uVar2) < (long)uVar7)) goto LAB_007f5a7d;
    pdVar8 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + uVar7;
    uVar7 = uVar2;
    if ((((ulong)pdVar8 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7), (long)uVar2 <= (long)uVar7)
       ) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    uVar10 = uVar2 - uVar7;
    uVar9 = uVar10 + 7;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if (0 < (long)uVar7) {
      uVar11 = 0;
      do {
        pdVar8[uVar11] = l * pdVar3[uVar11] + pdVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    uVar9 = (uVar9 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar10) {
      auVar5._8_8_ = in_XMM0_Qb;
      auVar5._0_8_ = l;
      auVar12 = vbroadcastsd_avx512f(auVar5);
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar13 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])(pdVar8 + uVar7));
        *(undefined1 (*) [64])(pdVar8 + uVar7) = auVar13;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar2) {
      do {
        pdVar8[uVar9] = l * pdVar3[uVar9] + pdVar8[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
  }
  pCVar1 = (this->super_ChConstraintThree).variables_c;
  if (pCVar1->disabled == false) {
    uVar2 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_cols;
    if ((long)uVar2 < 0) {
LAB_007f5a5b:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                   );
    }
    uVar7 = (ulong)pCVar1->offset;
    if (((long)(uVar2 | uVar7) < 0) ||
       ((long)((result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_rows - uVar2) < (long)uVar7)) {
LAB_007f5a7d:
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    pdVar8 = (result->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data + uVar7;
    uVar7 = uVar2;
    if ((((ulong)pdVar8 & 7) == 0) &&
       (uVar7 = (ulong)(-((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7), (long)uVar2 <= (long)uVar7)
       ) {
      uVar7 = uVar2;
    }
    pdVar3 = (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
             m_data;
    uVar10 = uVar2 - uVar7;
    uVar9 = uVar10 + 7;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if (0 < (long)uVar7) {
      uVar11 = 0;
      do {
        pdVar8[uVar11] = l * pdVar3[uVar11] + pdVar8[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar7 != uVar11);
    }
    uVar9 = (uVar9 & 0xfffffffffffffff8) + uVar7;
    if (7 < (long)uVar10) {
      auVar6._8_8_ = in_XMM0_Qb;
      auVar6._0_8_ = l;
      auVar12 = vbroadcastsd_avx512f(auVar6);
      do {
        auVar13 = vmulpd_avx512f(auVar12,*(undefined1 (*) [64])(pdVar3 + uVar7));
        auVar13 = vaddpd_avx512f(auVar13,*(undefined1 (*) [64])(pdVar8 + uVar7));
        *(undefined1 (*) [64])(pdVar8 + uVar7) = auVar13;
        uVar7 = uVar7 + 8;
      } while ((long)uVar7 < (long)uVar9);
    }
    if ((long)uVar9 < (long)uVar2) {
      do {
        pdVar8[uVar9] = l * pdVar3[uVar9] + pdVar8[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar2 != uVar9);
    }
  }
  return;
}

Assistant:

void ChConstraintThreeGeneric::MultiplyTandAdd(ChVectorDynamic<double>& result, double l) {
    if (variables_a->IsActive()) {
        result.segment(variables_a->GetOffset(), Cq_a.size()) += Cq_a.transpose() * l;
    }

    if (variables_b->IsActive()) {
        result.segment(variables_b->GetOffset(), Cq_b.size()) += Cq_b.transpose() * l;
    }

    if (variables_c->IsActive()) {
        result.segment(variables_c->GetOffset(), Cq_c.size()) += Cq_c.transpose() * l;
    }
}